

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsRelease(JsRef ref,uint *count)

{
  Recycler *this;
  bool bVar1;
  BOOL BVar2;
  ThreadContext *pTVar3;
  AutoNestedHandledExceptionType local_48 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (ref == (JsRef)0x0) {
    return JsErrorInvalidArgument;
  }
  if (count == (uint *)0x0) {
    bVar1 = Js::VarIs<Js::RecyclableObject>(ref);
    if (!bVar1) {
      return JsNoError;
    }
  }
  else {
    *count = 0;
    bVar1 = Js::VarIs<Js::RecyclableObject>(ref);
    if (!bVar1) {
      *count = 1;
      return JsNoError;
    }
  }
  bVar1 = JsrtContext::Is(ref);
  if (bVar1) {
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    Memory::Recycler::RootRelease(*(Recycler **)(**(long **)((long)ref + 0x10) + 0x588),ref,count);
  }
  else {
    pTVar3 = ThreadContext::GetContextForCurrentThread();
    if (pTVar3 == (ThreadContext *)0x0) {
      return JsErrorNoCurrentContext;
    }
    this = pTVar3->recycler;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    BVar2 = Memory::Recycler::IsValidObject(this,ref,0);
    if (BVar2 != 0) {
      Memory::Recycler::RootRelease(this,ref,count);
    }
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  return JsNoError;
}

Assistant:

CHAKRA_API JsRelease(_In_ JsRef ref, _Out_opt_ unsigned int *count)
{
    VALIDATE_JSREF(ref);
    if (count != nullptr)
    {
        *count = 0;
    }

    if (Js::TaggedNumber::Is(ref))
    {
        // The count is always one because these are never collected
        if (count)
        {
            *count = 1;
        }
        return JsNoError;
    }

    if (JsrtContext::Is(ref))
    {
        return GlobalAPIWrapper_NoRecord([&] () -> JsErrorCode
        {
            Recycler * recycler = static_cast<JsrtContext *>(ref)->GetRuntime()->GetThreadContext()->GetRecycler();
            recycler->RootRelease(ref, count);
            return JsNoError;
        });
    }
    else
    {
        ThreadContext* threadContext = ThreadContext::GetContextForCurrentThread();
        if (threadContext == nullptr)
        {
            return JsErrorNoCurrentContext;
        }
        Recycler * recycler = threadContext->GetRecycler();
        return GlobalAPIWrapper([&](TTDRecorder& _actionEntryPopper) -> JsErrorCode
        {
            // Note, some references may live in arena-allocated memory, so we need to do this check
            if (!recycler->IsValidObject(ref))
            {
                return JsNoError;
            }

            recycler->RootRelease(ref, count);

            return JsNoError;
        });
    }
}